

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

dtime_t __thiscall duckdb::StrpTimeFormat::ParseResult::ToTime(ParseResult *this)

{
  undefined1 auVar1 [16];
  dtime_t dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar3 = this->data[7];
  iVar5 = (int)((ulong)((long)iVar3 * 0x6e5d4c3b) >> 0x20) - iVar3;
  iVar3 = iVar3 % 0xe10;
  iVar4 = (int)((ulong)((long)iVar3 * 0x77777777) >> 0x20) - iVar3;
  auVar1 = SEXT816((long)this->data[6] + 500) * SEXT816(0x20c49ba5e353f7cf);
  dVar2 = Time::FromTime(((iVar5 >> 0xb) - (iVar5 >> 0x1f)) + this->data[3],
                         ((iVar4 >> 5) - (iVar4 >> 0x1f)) + this->data[4],
                         ((iVar3 / 0x3c) * 0x3c - iVar3) + this->data[5],
                         (int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f));
  return (dtime_t)dVar2.micros;
}

Assistant:

dtime_t StrpTimeFormat::ParseResult::ToTime() {
	int hh, mm, ss;
	StrfTimeSplitOffset(data[7], hh, mm, ss);
	return Time::FromTime(data[3] - hh, data[4] - mm, data[5] - ss, GetMicros());
}